

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O3

ModelCircuitLibrary * __thiscall lsim::LSimContext::library_by_name(LSimContext *this,char *name)

{
  int iVar1;
  iterator iVar2;
  ModelCircuitLibrary *pMVar3;
  string sname;
  allocator local_59;
  key_type local_58;
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string((string *)local_38,name,(allocator *)&local_58);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 == 0) {
    pMVar3 = &this->m_user_library;
  }
  else {
    std::__cxx11::string::string((string *)&local_58,name,&local_59);
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_reference_libraries)._M_h,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pMVar3 = (ModelCircuitLibrary *)0x0;
    }
    else {
      pMVar3 = *(ModelCircuitLibrary **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
                       ._M_cur + 0x28);
    }
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return pMVar3;
}

Assistant:

ModelCircuitLibrary *LSimContext::library_by_name(const char *name) {
    std::string sname = name;
    if (sname == "user") {
        return &m_user_library;
    }

    auto found = m_reference_libraries.find(name);
    if (found != m_reference_libraries.end()) {
        return found->second.get();
    }

    return nullptr;
}